

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_concurrency.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ca88::
ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTConcurrencyTest_Node4ParallelOps_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  (anonymous_namespace)::
  ARTConcurrencyTest<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
  ::key_range_op_test<3u,8ul,6ul>
            ((ARTConcurrencyTest<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              *)this);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTConcurrencyTest, Node4ParallelOps) {
  this->template key_range_op_test<3, 8, 6>();
}